

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
openjij::test::RESULT_GetSolutionFromTrotter_Test::TestBody
          (RESULT_GetSolutionFromTrotter_Test *this)

{
  float *pfVar1;
  TransverseIsing<openjij::graph::Dense<float>_> *system;
  pointer this_00;
  char *message;
  initializer_list<int> __l;
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertionResult gtest_ar;
  TrotterSpins init_trotter_spins;
  Dense<float> graph;
  Spins solution;
  Xorshift local_a8;
  TransverseIsing<openjij::graph::Dense<float>_> q_sys;
  
  openjij::graph::Dense<float>::Dense(&graph,4);
  pfVar1 = openjij::graph::Dense<float>::J(&graph,1,1);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&graph,0,1);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&graph,1,2);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&graph,2,3);
  *pfVar1 = 1.0;
  local_a8.x = 0x75bcd15;
  local_a8.y = 0x159a55e5;
  local_a8.z = 0x1f123bb5;
  local_a8.w = 0x4d2;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&init_trotter_spins,4,(allocator_type *)&q_sys);
  for (this_00 = init_trotter_spins.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      init_trotter_spins.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    openjij::graph::Graph::gen_spin<openjij::utility::Xorshift>
              ((Spins *)&q_sys,&graph.super_Graph,&local_a8);
    std::vector<int,_std::allocator<int>_>::operator=
              (this_00,(vector<int,_std::allocator<int>_> *)&q_sys);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&q_sys);
  }
  solution.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000001;
  solution.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0xffffffff00000001;
  __l._M_len = 4;
  __l._M_array = (iterator)&solution;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&q_sys,__l,(allocator_type *)&gtest_ar);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (init_trotter_spins.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&q_sys);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&q_sys);
  openjij::system::TransverseIsing<openjij::graph::Dense<float>_>::TransverseIsing
            (&q_sys,&init_trotter_spins,&graph,1.0);
  openjij::result::get_solution<openjij::graph::Dense<float>>(&solution,(result *)&q_sys,system);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"solution","init_trotter_spins[0]",&solution,
             init_trotter_spins.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/result/result.hpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&solution.super__Vector_base<int,_std::allocator<int>_>);
  openjij::system::TransverseIsing<openjij::graph::Dense<float>_>::~TransverseIsing(&q_sys);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&init_trotter_spins);
  free(graph._J.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

TEST(RESULT, GetSolutionFromTrotter){
   auto graph = openjij::graph::Dense<float>(4);
   graph.J(1, 1) = -1.0;
   graph.J(0, 1) = -1.0;
   graph.J(1, 2) = -1.0;
   graph.J(2, 3) = 1.0;
   
   auto r = openjij::utility::Xorshift(1234);
   int num_trotter_slices = 4;
   openjij::system::TrotterSpins init_trotter_spins(num_trotter_slices);
   for(auto& spins : init_trotter_spins){
      spins = graph.gen_spin(r);
   }
   
   init_trotter_spins[0] = openjij::graph::Spins({1, 1, 1, -1});
   
   auto q_sys = openjij::system::make_transverse_ising(init_trotter_spins, graph, 1.0);
   // get_solution get minimum energy state
   auto solution = openjij::result::get_solution(q_sys);
   EXPECT_EQ(solution, init_trotter_spins[0]);
}